

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

NondegeneracyCheckResult * __thiscall
slang::ast::SequenceWithMatchExpr::checkNondegeneracyImpl
          (NondegeneracyCheckResult *__return_storage_ptr__,SequenceWithMatchExpr *this)

{
  bitmask<slang::ast::NondegeneracyStatus> bVar1;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  bool bStack_44;
  NondegeneracyCheckResult local_40;
  
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  uStack_48 = 0;
  bStack_44 = false;
  bVar1.m_bits = 0;
  if ((this->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload
      .super__Optional_payload_base<slang::ast::SequenceRepetition>._M_engaged == true) {
    SequenceRepetition::checkNondegeneracy((SequenceRepetition *)&this->repetition);
    local_58 = local_40._4_4_;
    uStack_54 = local_40.noMatchRange.startLoc._0_4_;
    uStack_50 = local_40.noMatchRange.startLoc._4_4_;
    uStack_4c = CONCAT31(local_40.noMatchRange.endLoc._1_3_,local_40.noMatchRange.endLoc._0_1_);
    uStack_48 = local_40.noMatchRange.endLoc._4_4_;
    bStack_44 = local_40.isAlwaysFalse;
    bVar1.m_bits = local_40.status.m_bits;
  }
  AssertionExpr::checkNondegeneracy(&local_40,this->expr);
  (__return_storage_ptr__->status).m_bits = bVar1.m_bits;
  *(ulong *)&__return_storage_ptr__->field_0x4 = CONCAT44(uStack_54,local_58);
  *(ulong *)&(__return_storage_ptr__->noMatchRange).startLoc.field_0x4 =
       CONCAT44(uStack_4c,uStack_50);
  *(ulong *)&(__return_storage_ptr__->noMatchRange).endLoc.field_0x1 =
       CONCAT17(bStack_44,CONCAT43(uStack_48,uStack_4c._1_3_));
  AssertionExpr::NondegeneracyCheckResult::operator|=(__return_storage_ptr__,&local_40);
  return __return_storage_ptr__;
}

Assistant:

AssertionExpr::NondegeneracyCheckResult SequenceWithMatchExpr::checkNondegeneracyImpl() const {
    NondegeneracyCheckResult result;
    if (repetition)
        result = repetition->checkNondegeneracy();

    return result | expr.checkNondegeneracy();
}